

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateFastLdElemI(Lowerer *this,Instr **ldElem,bool *instrIsInHelperBlockRef)

{
  ushort uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  IRType IVar5;
  bool bVar6;
  ValueType valueType;
  uint32 uVar7;
  BailOutKind BVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  IndirOpnd *pIVar12;
  undefined7 extraout_var;
  ProfiledInstr *pPVar13;
  LabelInstr *pLVar14;
  Instr *this_00;
  HelperCallOpnd *newSrc;
  RegOpnd *pRVar15;
  IndirOpnd *pIVar16;
  BailOutInfo *pBVar17;
  Instr *pIVar18;
  RegOpnd *pRVar19;
  Opnd *pOVar20;
  IntConstOpnd *pIVar21;
  BranchInstr *instr;
  JITTimeFunctionBody *pJVar22;
  char16 *pcVar23;
  char16 *pcVar24;
  char16 *pcVar25;
  ushort uVar26;
  LabelInstr *target;
  Lowerer *this_01;
  char16_t *pcVar27;
  byte bVar28;
  FldInfoFlags flags;
  JnHelperMethod fnHelper;
  wchar local_218 [4];
  char16 debugStringBuffer_1 [42];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1b8 [4];
  char16 debugStringBuffer [42];
  undefined1 local_b8 [8];
  AutoReuseOpnd autoReuseIndirOpnd;
  undefined1 local_90 [8];
  AutoReuseOpnd autoReuseReg;
  RegOpnd *local_70;
  Opnd *maskOpnd;
  LabelInstr *local_60;
  LabelInstr *local_58;
  undefined4 local_50;
  bool local_4c;
  bool local_4b;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  uint local_48;
  bool isTypedArrayElement;
  bool isStringIndex;
  ValueType baseValueType;
  LabelInstr *pLStack_40;
  bool indirOpndOverflowed;
  bool local_31 [8];
  bool emitBailout;
  
  if (instrIsInHelperBlockRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x46fa,"(instrIsInHelperBlockRef)","instrIsInHelperBlockRef");
    if (!bVar4) goto LAB_00556cf6;
    *puVar11 = 0;
  }
  *instrIsInHelperBlockRef = false;
  pOVar20 = (*ldElem)->m_src1;
  autoReuseIndirOpnd._16_8_ = instrIsInHelperBlockRef;
  bVar4 = IR::Opnd::IsIndirOpnd(pOVar20);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4704,"(src1->IsIndirOpnd())","Expected indirOpnd on LdElementI");
    if (!bVar4) goto LAB_00556cf6;
    *puVar11 = 0;
  }
  pIVar12 = IR::Opnd::AsIndirOpnd(pOVar20);
  pIVar18 = *ldElem;
  if (pIVar18->m_opcode == LdMethodElem) {
    local_1b8[0] = (pIVar12->m_baseOpnd->super_Opnd).m_valueType.field_0;
    bVar4 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_1b8[0].field_0);
    bVar28 = 1;
    if (bVar4) goto LAB_0055600b;
    pIVar18 = *ldElem;
  }
  local_50 = 0;
  local_58 = IR::Instr::GetOrCreateContinueLabel(pIVar18,false);
  local_60 = IR::LabelInstr::New(Label,this->m_func,true);
  bVar4 = IR::Instr::DoStackArgsOpt(*ldElem);
  if (!bVar4) {
    local_1b8[0] = (pIVar12->m_baseOpnd->super_Opnd).m_valueType.field_0;
    bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_1b8[0].field_0);
    local_50 = (undefined4)CONCAT71(extraout_var,bVar4);
  }
  local_31[0] = false;
  bVar4 = IR::Instr::DoStackArgsOpt(*ldElem);
  if (bVar4) {
    GenerateFastArgumentsLdElemI(this,*ldElem,local_58);
    local_31[0] = true;
LAB_00555c7d:
    pLVar14 = (LabelInstr *)0x0;
    target = (LabelInstr *)0x0;
LAB_00555c82:
    IR::Instr::InsertBefore(*ldElem,&local_60->super_Instr);
    *(undefined1 *)autoReuseIndirOpnd._16_8_ = 1;
    if ((char)local_50 != '\0') {
      if (((*ldElem)->field_0x38 & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x48cc,"(ldElem->HasBailOutInfo())","ldElem->HasBailOutInfo()");
        if (!bVar4) goto LAB_00556cf6;
        *puVar11 = 0;
      }
      if (local_60 == target) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x48cd,"(labelHelper != labelBailOut)","labelHelper != labelBailOut");
        if (!bVar4) goto LAB_00556cf6;
        *puVar11 = 0;
      }
      LowerOneBailOutKind(this,*ldElem,BailOutConventionalNativeArrayAccessOnly,false,false);
      pIVar18 = (*ldElem)->m_next;
      pPVar13 = IR::Instr::AsProfiledInstr(*ldElem);
      local_1b8[0] = (((pPVar13->u).ldElemInfo)->elemType).field_0;
      bVar4 = ValueType::HasBeenUndefined((ValueType *)&local_1b8[0].field_0);
      if (bVar4) {
        if (local_31[0] == false) {
          if (pLVar14 == (LabelInstr *)0x0) {
            pLVar14 = IR::LabelInstr::New(Label,this->m_func,true);
            (pLVar14->super_Instr).m_noLazyHelperAssert = true;
          }
          InsertMissingItemCompareBranch(this,(*ldElem)->m_dst,BrEq_A,pLVar14,pIVar18);
        }
        InsertBranch(Br,local_58,pIVar18);
        if (pLVar14 != (LabelInstr *)0x0) {
          maskOpnd = (Opnd *)target;
          IR::Instr::InsertBefore(pIVar18,&pLVar14->super_Instr);
          autoReuseReg._16_8_ = ldElem;
          pIVar12 = IR::Opnd::AsIndirOpnd((*ldElem)->m_src1);
          local_1b8[0] = (pIVar12->m_baseOpnd->super_Opnd).m_valueType.field_0;
          bVar4 = ValueType::HasIntElements((ValueType *)&local_1b8[0].field_0);
          fnHelper = HelperIntArr_ToVarArray;
          if (!bVar4) {
            local_1b8[0] = (pIVar12->m_baseOpnd->super_Opnd).m_valueType.field_0;
            bVar4 = ValueType::HasFloatElements((ValueType *)&local_1b8[0].field_0);
            fnHelper = HelperFloatArr_ToVarArray;
            if (!bVar4) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar11 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x4905,
                                 "(indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements())",
                                 "indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements()");
              if (!bVar4) {
LAB_00556cf6:
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              *puVar11 = 0;
            }
          }
          LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar18,&pIVar12->m_baseOpnd->super_Opnd)
          ;
          this_00 = IR::Instr::New(Call,this->m_func);
          newSrc = IR::HelperCallOpnd::New(fnHelper,this->m_func);
          IR::Instr::SetSrc1(this_00,&newSrc->super_Opnd);
          IR::Instr::InsertBefore(pIVar18,this_00);
          LowererMD::LowerCall(&this->m_lowererMD,this_00,0);
          target = (LabelInstr *)maskOpnd;
          ldElem = (Instr **)autoReuseReg._16_8_;
        }
      }
      else {
        if (local_31[0] == false) {
          InsertMissingItemCompareBranch(this,(*ldElem)->m_dst,BrEq_A,target,pIVar18);
        }
        InsertBranch(Br,local_58,pIVar18);
      }
      IR::Instr::InsertBefore(pIVar18,&target->super_Instr);
    }
    bVar28 = 1;
    if (local_31[0] != true) goto LAB_0055600b;
    IR::Instr::UnlinkSrc1(*ldElem);
    IR::Instr::UnlinkDst(*ldElem);
    GenerateBailOut(this,*ldElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    bVar28 = local_31[0];
  }
  else {
    bVar4 = GenerateFastStringLdElem(this,*ldElem,local_60,local_58);
    if (bVar4) goto LAB_00555c7d;
    if ((char)local_50 == '\0') {
      maskOpnd = (Opnd *)0x0;
      pLStack_40 = local_60;
    }
    else {
      bVar28 = 1;
      if ((*ldElem)->m_dst->m_type == TyVar) goto LAB_0055600b;
      if ((*ldElem)->m_kind != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x4742,"(ldElem->IsProfiledInstr())","ldElem->IsProfiledInstr()");
        if (!bVar4) goto LAB_00556cf6;
        *puVar11 = 0;
      }
      maskOpnd = (Opnd *)IR::LabelInstr::New(Label,this->m_func,true);
      pLStack_40 = (LabelInstr *)maskOpnd;
    }
    pIVar18 = *ldElem;
    autoReuseReg._16_8_ = ldElem;
    if (pIVar18->m_kind == InstrKindProfiled) {
      pPVar13 = IR::Instr::AsProfiledInstr(pIVar18);
      flags = ((pPVar13->u).ldElemInfo)->flags;
      pIVar18 = *ldElem;
    }
    else {
      flags = FldInfo_NoInfo;
    }
    baseValueType.field_0.bits._1_1_ = 0;
    local_70 = (RegOpnd *)0x0;
    pIVar12 = IR::Opnd::AsIndirOpnd(pOVar20);
    pIVar12 = GenerateFastElemICommon
                        (this,pIVar18,false,pIVar12,local_60,pLStack_40,local_58,&local_4c,&local_4b
                         ,local_31,(Opnd **)&local_70,(LabelInstr **)0x0,true,false,false,
                         (LabelInstr *)0x0,(bool *)((long)&baseValueType.field_0.bits + 1),flags);
    ldElem = (Instr **)autoReuseReg._16_8_;
    pLStack_40 = *(LabelInstr **)(*(long *)autoReuseReg._16_8_ + 0x40);
    pRVar15 = IR::Opnd::AsRegOpnd((Opnd *)pLStack_40);
    if (pIVar12 != (IndirOpnd *)0x0) {
      local_48 = (uint)(pRVar15->super_Opnd).m_type;
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)local_b8,&pIVar12->super_Opnd,this->m_func,true);
      pIVar16 = IR::Opnd::AsIndirOpnd(pOVar20);
      local_4a = (pIVar16->m_baseOpnd->super_Opnd).m_valueType.field_0;
      if (((*ldElem)->field_0x38 & 0x10) == 0) {
LAB_0055618a:
        pIVar16 = IR::Opnd::AsIndirOpnd(pOVar20);
        if (pIVar16->m_indexOpnd != (RegOpnd *)0x0) {
          pIVar16 = IR::Opnd::AsIndirOpnd(pOVar20);
          bVar4 = IR::Opnd::IsEqual((Opnd *)pLStack_40,&pIVar16->m_indexOpnd->super_Opnd);
          if (bVar4) goto LAB_005561b2;
        }
      }
      else {
        uVar7 = IR::Instr::GetByteCodeOffset(*ldElem);
        if (uVar7 == 0xffffffff) goto LAB_0055618a;
        pBVar17 = IR::Instr::GetBailOutInfo(*ldElem);
        uVar2 = pBVar17->bailOutOffset;
        uVar7 = IR::Instr::GetByteCodeOffset(*ldElem);
        if (uVar7 < uVar2) goto LAB_0055618a;
        pIVar16 = IR::Opnd::AsIndirOpnd(pOVar20);
        bVar4 = IR::Opnd::IsEqual((Opnd *)pLStack_40,&pIVar16->m_baseOpnd->super_Opnd);
        if (!bVar4) goto LAB_0055618a;
LAB_005561b2:
        pIVar18 = IR::Instr::SinkDst(*ldElem,Ld_A,RegNOREG,(Instr *)0x0);
        IR::Instr::Unlink(pIVar18);
        IR::Instr::InsertAfter(&local_58->super_Instr,pIVar18);
        LowererMD::ChangeToAssign(pIVar18);
        pLStack_40 = *(LabelInstr **)((long)*ldElem + 0x40);
      }
      if (local_4c == true) {
        local_90 = (undefined1  [8])0x0;
        autoReuseReg.func._1_1_ = 1;
        bVar4 = IR::Opnd::IsRegOpnd((Opnd *)pLStack_40);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x47df,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
          if (!bVar4) goto LAB_00556cf6;
          *puVar11 = 0;
        }
        IVar5 = (pIVar12->super_Opnd).m_type;
        if ((byte)(IVar5 - TyFloat32) < 2) {
          if ((local_48 != 10) && (local_48 != 0x17)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x47e3,"((dstType == TyFloat64) || (dstType == TyVar))",
                               "For Float32Array LdElemI\'s dst should be specialized to TyFloat64 or not at all."
                              );
            if (!bVar4) goto LAB_00556cf6;
            *puVar11 = 0;
            IVar5 = (pIVar12->super_Opnd).m_type;
          }
          if (IVar5 == TyFloat64) {
LAB_00556a3b:
            if (local_48 == 10) {
              pRVar15 = IR::Opnd::AsRegOpnd((Opnd *)pLStack_40);
            }
            else {
              pRVar15 = IR::RegOpnd::New(TyFloat64,this->m_func);
            }
            IR::AutoReuseOpnd::Initialize
                      ((AutoReuseOpnd *)local_90,&pRVar15->super_Opnd,this->m_func,true);
            InsertMove(&pRVar15->super_Opnd,&pIVar12->super_Opnd,*ldElem,true);
          }
          else {
            if (IVar5 != TyFloat32) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar11 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x47f3,"(indirOpnd->IsFloat64())","indirOpnd->IsFloat64()");
              if (!bVar4) goto LAB_00556cf6;
              *puVar11 = 0;
              goto LAB_00556a3b;
            }
            pRVar19 = IR::RegOpnd::New(TyFloat32,this->m_func);
            IR::AutoReuseOpnd::AutoReuseOpnd
                      ((AutoReuseOpnd *)&local_1b8[0].field_0,&pRVar19->super_Opnd,this->m_func,true
                      );
            InsertMove(&pRVar19->super_Opnd,&pIVar12->super_Opnd,*ldElem,true);
            if (local_48 == 10) {
              pRVar15 = IR::Opnd::AsRegOpnd((Opnd *)pLStack_40);
            }
            else {
              pRVar15 = IR::RegOpnd::New(TyFloat64,this->m_func);
            }
            IR::AutoReuseOpnd::Initialize
                      ((AutoReuseOpnd *)local_90,&pRVar15->super_Opnd,this->m_func,true);
            InsertConvertFloat32ToFloat64(&pRVar15->super_Opnd,&pRVar19->super_Opnd,*ldElem);
            IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&local_1b8[0].field_0);
          }
          if (local_48 != 10) {
            pRVar19 = IR::Opnd::AsRegOpnd((Opnd *)pLStack_40);
            LowererMD::SaveDoubleToVar(&this->m_lowererMD,pRVar19,pRVar15,*ldElem,*ldElem,false);
          }
          pIVar18 = IR::Instr::New(UCOMISD,this->m_func);
          IR::Instr::SetSrc1(pIVar18,&pRVar15->super_Opnd);
          IR::Instr::SetSrc2(pIVar18,&pRVar15->super_Opnd);
          IR::Instr::InsertBefore(*ldElem,pIVar18);
          instr = IR::BranchInstr::New(JP,local_60,this->m_func);
          IR::Instr::InsertBefore(*ldElem,&instr->super_Instr);
          if (local_48 == 10) {
LAB_00556bc9:
            local_31[0] = true;
          }
        }
        else {
          if ((local_48 == 3) || (local_48 == 0x17)) {
            if (local_48 != 3) goto LAB_00556873;
            pRVar15 = IR::Opnd::AsRegOpnd((Opnd *)pLStack_40);
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x482a,"((dstType == TyInt32) || (dstType == TyVar))",
                               "For Int/UintArray LdElemI\'s dst should be specialized to TyInt32 or not at all."
                              );
            if (!bVar4) goto LAB_00556cf6;
            *puVar11 = 0;
LAB_00556873:
            pRVar15 = IR::RegOpnd::New(TyInt32,this->m_func);
          }
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)local_90,&pRVar15->super_Opnd,this->m_func,true);
          if ((pIVar12->super_Opnd).m_type != TyUint32) {
            valueType = ValueType::GetTaggedInt();
            IR::Opnd::SetValueType(&pRVar15->super_Opnd,valueType);
          }
          pIVar18 = InsertMove(&pRVar15->super_Opnd,&pIVar12->super_Opnd,*ldElem,true);
          if (local_70 != (RegOpnd *)0x0) {
            IVar5 = (pRVar15->super_Opnd).m_type;
            if (TySize[(local_70->super_Opnd).m_type] != (uint)IVar5) {
              pOVar20 = IR::Opnd::UseWithNewType(&local_70->super_Opnd,IVar5,this->m_func);
              local_70 = IR::Opnd::AsRegOpnd(pOVar20);
            }
            pIVar18 = InsertAnd(&pRVar15->super_Opnd,&pRVar15->super_Opnd,&local_70->super_Opnd,
                                *ldElem);
          }
          if (local_48 == 3) {
            uVar26 = *(ushort *)((long)*ldElem + 0x36) & 2;
            uVar1 = *(ushort *)&pIVar18->field_0x36;
            *(ushort *)&pIVar18->field_0x36 = uVar1 & 0xfffd | uVar26;
            *(ushort *)&pIVar18->field_0x36 =
                 uVar1 & 0xfff9 | uVar26 | *(ushort *)((long)*ldElem + 0x36) & 4;
            if ((pIVar12->super_Opnd).m_type == TyUint32) {
              this_01 = (Lowerer *)0x0;
              pIVar21 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,true);
              InsertCompareBranch(this_01,&pRVar15->super_Opnd,&pIVar21->super_Opnd,BrLt_A,local_60,
                                  *ldElem,false);
            }
            goto LAB_00556bc9;
          }
          pIVar18 = IR::Instr::New(ToVar,(Opnd *)pLStack_40,&pRVar15->super_Opnd,this->m_func);
          uVar26 = *(ushort *)((long)*ldElem + 0x36) & 2;
          uVar1 = *(ushort *)&pIVar18->field_0x36;
          *(ushort *)&pIVar18->field_0x36 = uVar1 & 0xfffd | uVar26;
          *(ushort *)&pIVar18->field_0x36 =
               uVar1 & 0xfff9 | uVar26 | *(ushort *)((long)*ldElem + 0x36) & 4;
          IR::Instr::InsertBefore(*ldElem,pIVar18);
          LowererMD::EmitLoadVar
                    (&this->m_lowererMD,pIVar18,(pIVar12->super_Opnd).m_type == TyUint32,false);
        }
        InsertBranch(Br,local_58,*ldElem);
        uVar9 = Func::GetSourceContextId(this->m_func);
        uVar10 = Func::GetLocalFunctionId(this->m_func);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TypedArrayTypeSpecPhase,uVar9,uVar10);
        if (bVar4) {
          uVar9 = Func::GetSourceContextId(this->m_func);
          uVar10 = Func::GetLocalFunctionId(this->m_func);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,LowererPhase,uVar9,uVar10);
          if (bVar4) {
            ValueType::ToString((ValueType *)&local_4a.field_0,(char (*) [256])local_1b8);
            pJVar22 = Func::GetJITFunctionBody(this->m_func);
            pcVar23 = JITTimeFunctionBody::GetDisplayName(pJVar22);
            pcVar24 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])local_218);
            pcVar25 = Js::OpCodeUtil::GetOpCodeName(*(OpCode *)((long)*ldElem + 0x30));
            pcVar27 = L"specialized";
            if (((Opnd *)pLStack_40)->m_type == TyVar) {
              pcVar27 = L"not specialized";
            }
            Output::Print(L"Typed Array Lowering: function: %s (%s), instr: %s, base value type: %S, %s."
                          ,pcVar23,pcVar24,pcVar25,local_1b8,pcVar27);
            Output::Print(L"\n");
            Output::Flush();
          }
        }
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_90);
LAB_00556cde:
        pLVar14 = (LabelInstr *)0x0;
      }
      else {
        InsertMove((Opnd *)pLStack_40,&pIVar12->super_Opnd,*ldElem,true);
        if (local_70 != (RegOpnd *)0x0) {
          if (TySize[(local_70->super_Opnd).m_type] != (uint)((Opnd *)pLStack_40)->m_type) {
            pOVar20 = IR::Opnd::UseWithNewType
                                (&local_70->super_Opnd,((Opnd *)pLStack_40)->m_type,this->m_func);
            local_70 = IR::Opnd::AsRegOpnd(pOVar20);
          }
          InsertAnd((Opnd *)pLStack_40,(Opnd *)pLStack_40,&local_70->super_Opnd,*ldElem);
        }
        if ((char)local_50 != '\0' || local_4b != false) {
          if (local_4b == false) {
            bVar4 = false;
            goto LAB_0055650c;
          }
LAB_00556778:
          InsertBranch(Br,local_58,*ldElem);
          goto LAB_00556cde;
        }
        bVar4 = *(short *)((long)*ldElem + 0x30) == 0x99;
LAB_0055650c:
        bVar6 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_4a.field_0);
        if (bVar6) {
          bVar6 = ValueType::HasNoMissingValues((ValueType *)&local_4a.field_0);
          if (!bVar6) goto LAB_00556537;
          if (bVar4 == false) goto LAB_00556778;
          pLVar14 = (LabelInstr *)0x0;
LAB_00556aa0:
          LowererMD::GenerateObjectTest(&this->m_lowererMD,(Opnd *)pLStack_40,*ldElem,local_58,true)
          ;
        }
        else {
LAB_00556537:
          pLVar14 = local_58;
          if (bVar4 != false) {
            pLVar14 = local_60;
          }
          InsertMissingItemCompareBranch(this,(Opnd *)pLStack_40,bVar4 ^ BrNeq_A,pLVar14,*ldElem);
          if ((char)local_50 == '\0') {
LAB_00556a94:
            pLVar14 = (LabelInstr *)0x0;
          }
          else {
            if (bVar4 != false) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar11 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x489e,"(!needObjectTest)","!needObjectTest");
              if (!bVar6) goto LAB_00556cf6;
              *puVar11 = 0;
            }
            if (local_60 == (LabelInstr *)maskOpnd) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar11 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x489f,"(labelHelper != labelBailOut)",
                                 "labelHelper != labelBailOut");
              if (!bVar6) goto LAB_00556cf6;
              *puVar11 = 0;
            }
            pOVar20 = maskOpnd;
            pPVar13 = IR::Instr::AsProfiledInstr(*ldElem);
            local_1b8[0] = (((pPVar13->u).ldElemInfo)->elemType).field_0;
            bVar6 = ValueType::HasBeenUndefined((ValueType *)&local_1b8[0].field_0);
            if (!bVar6) {
              InsertBranch(Br,(LabelInstr *)pOVar20,*ldElem);
              goto LAB_00556a94;
            }
            pLVar14 = IR::LabelInstr::New(Label,this->m_func,true);
            InsertBranch(Br,pLVar14,*ldElem);
          }
          if (bVar4 != false) goto LAB_00556aa0;
        }
      }
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_b8);
      target = (LabelInstr *)maskOpnd;
      goto LAB_00555c82;
    }
    if (((*ldElem)->field_0x38 & 0x10) != 0) {
      BVar8 = IR::Instr::GetBailOutKind(*ldElem);
      if (((BVar8 >> 0x11 & 1) != 0) && (baseValueType.field_0.bits._1_1_ == '\0')) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x4769,
                           "(!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed)"
                           ,
                           "!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed"
                          );
        if (!bVar4) goto LAB_00556cf6;
        *puVar11 = 0;
      }
    }
    if ((baseValueType.field_0.bits._1_1_ != '\x01') || (((*ldElem)->field_0x38 & 0x10) == 0)) {
      if (((Opnd *)pLStack_40)->m_type != TyVar) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x47af,"(false)",
                           "Global optimizer shouldn\'t have specialized this instruction.");
        if (bVar4) {
          *puVar11 = 0;
          bVar4 = IR::Opnd::IsRegOpnd((Opnd *)pLStack_40);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x47b0,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
            if (!bVar4) goto LAB_00556cf6;
            *puVar11 = 0;
          }
          bVar28 = 0;
          pIVar21 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,true);
          InsertMove((Opnd *)pLStack_40,&pIVar21->super_Opnd,*ldElem,true);
          IR::Instr::FreeSrc1(*ldElem);
          IR::Instr::FreeDst(*ldElem);
          GenerateBailOut(this,*ldElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
          goto LAB_0055600b;
        }
        goto LAB_00556cf6;
      }
      uVar9 = Func::GetSourceContextId(this->m_func);
      uVar10 = Func::GetLocalFunctionId(this->m_func);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,TypedArrayTypeSpecPhase,uVar9,uVar10);
      bVar28 = 1;
      if (bVar4) {
        uVar9 = Func::GetSourceContextId(this->m_func);
        uVar10 = Func::GetLocalFunctionId(this->m_func);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,LowererPhase,uVar9,uVar10);
        if (bVar4) {
          pJVar22 = Func::GetJITFunctionBody(this->m_func);
          pcVar23 = JITTimeFunctionBody::GetDisplayName(pJVar22);
          pcVar24 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])local_1b8);
          pcVar25 = Js::OpCodeUtil::GetOpCodeName(*(OpCode *)((long)*ldElem + 0x30));
          Output::Print(L"Typed Array Lowering: function: %s (%s): instr %s, not specialized by glob opt due to negative or not likely int index.\n"
                        ,pcVar23,pcVar24,pcVar25);
          Output::Flush();
        }
      }
      goto LAB_0055600b;
    }
    BVar8 = IR::Instr::GetBailOutKind(*ldElem);
    bVar28 = (BVar8 & ~BailOutKindBits) == BailOutConventionalTypedArrayAccessOnly;
    if ((bool)bVar28) {
      IVar5 = ((Opnd *)pLStack_40)->m_type;
      if (IVar5 == TyVar) {
        pOVar20 = LoadLibraryValueOpnd(this,*ldElem,ValueUndefined);
        InsertMove((Opnd *)pLStack_40,pOVar20,*ldElem,true);
        IR::Instr::FreeSrc1(*ldElem);
        IR::Instr::FreeDst(*ldElem);
        IR::Instr::Remove(*ldElem);
        goto LAB_005567ea;
      }
LAB_005567fd:
      if ((byte)(IVar5 - TyFloat32) < 2) {
        pIVar21 = (IntConstOpnd *)IR::FloatConstOpnd::New(NAN,TyFloat64,this->m_func);
      }
      else {
        pIVar21 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,true);
      }
      InsertMove((Opnd *)pLStack_40,&pIVar21->super_Opnd,*ldElem,true);
      IR::Instr::FreeSrc1(*ldElem);
      IR::Instr::FreeDst(*ldElem);
      GenerateBailOut(this,*ldElem,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
      bVar28 = 1;
    }
    else {
LAB_005567ea:
      if ((BVar8 & (BailOutOnArrayAccessHelperCall|BailOutConventionalNativeArrayAccessOnly)) !=
          BailOutInvalid) {
        IVar5 = ((Opnd *)pLStack_40)->m_type;
        goto LAB_005567fd;
      }
    }
  }
  bVar28 = bVar28 ^ 1;
LAB_0055600b:
  return (bool)(bVar28 & 1);
}

Assistant:

bool
Lowerer::GenerateFastLdElemI(IR::Instr *& ldElem, bool *instrIsInHelperBlockRef)
{
    Assert(instrIsInHelperBlockRef);
    bool &instrIsInHelperBlock = *instrIsInHelperBlockRef;
    instrIsInHelperBlock = false;

    IR::LabelInstr *    labelHelper;
    IR::LabelInstr *    labelFallThru;
    IR::LabelInstr *    labelBailOut = nullptr;
    IR::LabelInstr *    labelMissingNative = nullptr;
    IR::Opnd *src1 =    ldElem->GetSrc1();

    AssertMsg(src1->IsIndirOpnd(), "Expected indirOpnd on LdElementI");

    IR::IndirOpnd *     indirOpnd = src1->AsIndirOpnd();

    // From FastElemICommon:
    //  TEST base, AtomTag                  -- check base not tagged int
    //  JNE $helper
    //  MOV r1, [base + offset(type)]       -- check base isArray
    //  CMP [r1 + offset(typeId)], TypeIds_Array
    //  JNE $helper
    //  TEST index, 1                       -- index tagged int
    //  JEQ $helper
    //  MOV r2, index
    //  SAR r2, Js::VarTag_Shift            -- remoe atom tag
    //  JS $helper                          -- exclude negative index
    //  MOV r4, [base + offset(head)]
    //  CMP r2, [r4 + offset(length)]       -- bounds check
    //  JAE $helper
    //  MOV r3, [r4 + offset(elements)]

    // Generated here:
    //  MOV dst, [r3 + r2]
    //  TEST dst, dst
    //  JNE $fallthrough

    if(ldElem->m_opcode == Js::OpCode::LdMethodElem && indirOpnd->GetBaseOpnd()->GetValueType().IsLikelyOptimizedTypedArray())
    {
        // Typed arrays don't return objects, so it's not worth generating a fast path for LdMethodElem. Calling the helper also
        // generates a better error message. Skip the fast path and just generate a helper call.
        return true;
    }

    labelFallThru = ldElem->GetOrCreateContinueLabel();
    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    // If we know for sure (based on flow graph) we're loading from the arguments object, then ignore the (path-based) profile info.
    bool isNativeArrayLoad = !ldElem->DoStackArgsOpt() && indirOpnd->GetBaseOpnd()->GetValueType().IsLikelyNativeArray();
    bool needMissingValueCheck = true;
    bool emittedFastPath = false;
    bool emitBailout = false;

    if (ldElem->DoStackArgsOpt())
    {
        emittedFastPath = GenerateFastArgumentsLdElemI(ldElem, labelFallThru);
        emitBailout = true;
    }
    else if (GenerateFastStringLdElem(ldElem, labelHelper, labelFallThru))
    {
        emittedFastPath = true;
    }
    else
    {
        IR::LabelInstr * labelCantUseArray = labelHelper;
        if (isNativeArrayLoad)
        {
            if (ldElem->GetDst()->GetType() == TyVar)
            {
                // Skip the fast path and just generate a helper call
                return true;
            }

            // Specialized native array lowering for LdElem requires that it is profiled. When not profiled, GlobOpt should not
            // have specialized it.
            Assert(ldElem->IsProfiledInstr());

            labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
            labelCantUseArray = labelBailOut;
        }
        Js::FldInfoFlags flags = Js::FldInfo_NoInfo;
        if (ldElem->IsProfiledInstr())
        {
            flags = ldElem->AsProfiledInstr()->u.ldElemInfo->flags;
        }
        bool isTypedArrayElement, isStringIndex, indirOpndOverflowed = false;
        IR::Opnd* maskOpnd = nullptr;
        indirOpnd =
            GenerateFastElemICommon(
                ldElem,
                false,
                src1->AsIndirOpnd(),
                labelHelper,
                labelCantUseArray,
                labelFallThru,
                &isTypedArrayElement,
                &isStringIndex,
                &emitBailout,
                &maskOpnd,
                nullptr,    /* pLabelSegmentLengthIncreased */
                true,       /* checkArrayLengthOverflow */
                false,      /* forceGenerateFastPath */
                false,      /* returnLength */
                nullptr,    /* bailOutLabelInstr */
                &indirOpndOverflowed,
                flags);

        IR::Opnd *dst = ldElem->GetDst();
        IRType dstType = dst->AsRegOpnd()->GetType();

        // The index is negative or not int.
        if (indirOpnd == nullptr)
        {
            // could have bailout kind BailOutOnArrayAccessHelperCall if indirOpnd overflows
            Assert(!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed);

            // don't check fast path without bailout because it might not be TypedArray
            if (indirOpndOverflowed && ldElem->HasBailOutInfo())
            {
                bool bailoutForOpndOverflow = false;
                const IR::BailOutKind bailOutKind = ldElem->GetBailOutKind();

                // return undefined for typed array if load dest is var, bailout otherwise
                if ((bailOutKind & ~IR::BailOutKindBits) == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    if (dst->IsVar())
                    {
                        // returns undefined in case of indirOpnd overflow which is consistent with behavior of interpreter
                        IR::Opnd * undefinedOpnd = this->LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
                        InsertMove(dst, undefinedOpnd, ldElem);

                        ldElem->FreeSrc1();
                        ldElem->FreeDst();
                        ldElem->Remove();

                        emittedFastPath = true;
                    }
                    else
                    {
                        bailoutForOpndOverflow = true;
                    }
                }

                if (bailoutForOpndOverflow || (bailOutKind & (IR::BailOutConventionalNativeArrayAccessOnly | IR::BailOutOnArrayAccessHelperCall)))
                {
                    IR::Opnd * constOpnd = nullptr;
                    if (dst->IsFloat())
                    {
                        constOpnd = IR::FloatConstOpnd::New(Js::JavascriptNumber::NaN, TyFloat64, m_func);
                    }
                    else
                    {
                        constOpnd = IR::IntConstOpnd::New(0, TyInt32, this->m_func, true);
                    }
                    InsertMove(dst, constOpnd, ldElem);

                    ldElem->FreeSrc1();
                    ldElem->FreeDst();
                    GenerateBailOut(ldElem, nullptr, nullptr);
                    emittedFastPath = true;
                }

                return !emittedFastPath;
            }
            // The global optimizer should never type specialize a LdElem for which the index is not int or an integer constant
            // with a negative value. This would force an unconditional bail out on the main code path.
            else if (dst->IsVar())
            {
                if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->m_func) && PHASE_TRACE(Js::LowererPhase, this->m_func))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(_u("Typed Array Lowering: function: %s (%s): instr %s, not specialized by glob opt due to negative or not likely int index.\n"),
                        this->m_func->GetJITFunctionBody()->GetDisplayName(),
                        this->m_func->GetDebugNumberSet(debugStringBuffer),
                        Js::OpCodeUtil::GetOpCodeName(ldElem->m_opcode));
                    Output::Flush();
                }

                // We must be dealing with some unconventional index value.  Don't emit fast path, but go directly to helper.
                emittedFastPath = false;
                return true;
            }
            else
            {
                AssertMsg(false, "Global optimizer shouldn't have specialized this instruction.");
                Assert(dst->IsRegOpnd());

                // If global optimizer failed to notice the unconventional index and type specialized the dst,
                // there is nothing to do but bail out. This could happen if global optimizer's information based
                // on value tracking fails to recognize a non-integer index or a constant int index that is negative.
                // The bailout below ensures that we behave correctly in retail builds even under
                // these (unlikely) conditions. To satisfy the downstream code we must populate the type specialized operand
                // with some made up values, even though we will unconditionally bail out here and the values will never be
                // used.
                IR::IntConstOpnd *constOpnd = IR::IntConstOpnd::New(0, TyInt32, this->m_func, true);
                InsertMove(dst, constOpnd, ldElem);

                ldElem->FreeSrc1();
                ldElem->FreeDst();
                GenerateBailOut(ldElem, nullptr, nullptr);
                return false;
            }
        }

        const IR::AutoReuseOpnd autoReuseIndirOpnd(indirOpnd, m_func);
        const ValueType baseValueType(src1->AsIndirOpnd()->GetBaseOpnd()->GetValueType());

        if ((ldElem->HasBailOutInfo() &&
                ldElem->GetByteCodeOffset() != Js::Constants::NoByteCodeOffset &&
                ldElem->GetBailOutInfo()->bailOutOffset <= ldElem->GetByteCodeOffset() &&
                dst->IsEqual(src1->AsIndirOpnd()->GetBaseOpnd())) ||
            (src1->AsIndirOpnd()->GetIndexOpnd() && dst->IsEqual(src1->AsIndirOpnd()->GetIndexOpnd())))
        {
            // This is a pre-op bailout where the dst is the same as one of the srcs. The dst may be trashed before bailing out,
            // but since the operation will be processed again in the interpreter, src values need to be kept intact. Use a
            // temporary dst until after the operation is complete.
            IR::Instr *instrSink = ldElem->SinkDst(Js::OpCode::Ld_A);

            // The sink instruction needs to be on the fall-through path
            instrSink->Unlink();
            labelFallThru->InsertAfter(instrSink);

            LowererMD::ChangeToAssign(instrSink);
            dst = ldElem->GetDst();
        }

        if (isTypedArrayElement)
        {
            // For typedArrays, convert the loaded element to the appropriate type
            IR::RegOpnd *reg;
            IR::AutoReuseOpnd autoReuseReg;

            Assert(dst->IsRegOpnd());

            if(indirOpnd->IsFloat())
            {
                AssertMsg((dstType == TyFloat64) || (dstType == TyVar), "For Float32Array LdElemI's dst should be specialized to TyFloat64 or not at all.");

                if(indirOpnd->IsFloat32())
                {
                    // MOVSS reg32.f32, indirOpnd.f32
                    IR::RegOpnd *reg32 = IR::RegOpnd::New(TyFloat32, this->m_func);
                    const IR::AutoReuseOpnd autoReuseReg32(reg32, m_func);
                    InsertMove(reg32, indirOpnd, ldElem);

                    // CVTPS2PD dst/reg.f64, reg32.f64
                    reg = dstType == TyFloat64 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyFloat64, this->m_func);
                    autoReuseReg.Initialize(reg, m_func);
                    InsertConvertFloat32ToFloat64(reg, reg32, ldElem);
                }
                else
                {
                    Assert(indirOpnd->IsFloat64());

                    // MOVSD dst/reg.f64, indirOpnd.f64
                    reg = dstType == TyFloat64 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyFloat64, this->m_func);
                    autoReuseReg.Initialize(reg, m_func);
                    InsertMove(reg, indirOpnd, ldElem);
                }

                if (dstType != TyFloat64)
                {
                    // Convert reg.f64 to var
                    m_lowererMD.SaveDoubleToVar(dst->AsRegOpnd(), reg, ldElem, ldElem);
                }

#if FLOATVAR
                // For NaNs, go to the helper to guarantee we don't have an illegal NaN
                // TODO(magardn): move this to MD code.
#if _M_X64
                // UCOMISD reg, reg
                {
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::UCOMISD, this->m_func);
                    instr->SetSrc1(reg);
                    instr->SetSrc2(reg);
                    ldElem->InsertBefore(instr);
                }

                // JP $helper
                {
                    IR::Instr *const instr = IR::BranchInstr::New(Js::OpCode::JP, labelHelper, this->m_func);
                    ldElem->InsertBefore(instr);
                }
#elif _M_ARM64
                // FCMP reg, reg
                {
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::FCMP, this->m_func);
                    instr->SetSrc1(reg);
                    instr->SetSrc2(reg);
                    ldElem->InsertBefore(instr);
                }

                // BVS $helper
                {
                    IR::Instr *const instr = IR::BranchInstr::New(Js::OpCode::BVS, labelHelper, this->m_func);
                    ldElem->InsertBefore(instr);
                }
#endif
#endif

                if(dstType == TyFloat64)
                {
                    emitBailout = true;
                }
            }
            else
            {
                AssertMsg((dstType == TyInt32) || (dstType == TyVar), "For Int/UintArray LdElemI's dst should be specialized to TyInt32 or not at all.");

                reg = dstType == TyInt32 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyInt32, this->m_func);
                autoReuseReg.Initialize(reg, m_func);

                // Int32 and Uint32 arrays could overflow an int31, but the others can't
                if (indirOpnd->GetType() != TyUint32
#if !INT32VAR
                    && indirOpnd->GetType() != TyInt32
#endif
                    )
                {
                    reg->SetValueType(ValueType::GetTaggedInt());  // Fits as a tagged-int
                }

                // MOV/MOVZX/MOVSX dst/reg.int32, IndirOpnd.type
                IR::Instr* instrMov = InsertMove(reg, indirOpnd, ldElem);
                if (maskOpnd)
                {
#if TARGET_64
                    if (maskOpnd->GetSize() != reg->GetType())
                    {
                        maskOpnd = maskOpnd->UseWithNewType(reg->GetType(), m_func)->AsRegOpnd();
                    }
#endif
                    instrMov = InsertAnd(reg, reg, maskOpnd, ldElem);
                }

                if (dstType == TyInt32)
                {
                    instrMov->dstIsTempNumber = ldElem->dstIsTempNumber;
                    instrMov->dstIsTempNumberTransferred = ldElem->dstIsTempNumberTransferred;

                    if (indirOpnd->GetType() == TyUint32)
                    {
                        // TEST dst, dst
                        // JSB $helper (bailout)
                        InsertCompareBranch(
                            reg,
                            IR::IntConstOpnd::New(0, TyUint32, this->m_func, /* dontEncode = */ true),
                            Js::OpCode::BrLt_A,
                            labelHelper,
                            ldElem);
                    }

                    emitBailout = true;
                }
                else
                {
                    // MOV dst, reg
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::ToVar, dst, reg, this->m_func);
                    instr->dstIsTempNumber = ldElem->dstIsTempNumber;
                    instr->dstIsTempNumberTransferred = ldElem->dstIsTempNumberTransferred;
                    ldElem->InsertBefore(instr);

                    // Convert dst to var
                    m_lowererMD.EmitLoadVar(instr, /* isFromUint32 = */ (indirOpnd->GetType() == TyUint32));
                }
            }

            //  JMP $fallthrough
            InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

            emittedFastPath = true;

            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->m_func) && PHASE_TRACE(Js::LowererPhase, this->m_func))
            {
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("Typed Array Lowering: function: %s (%s), instr: %s, base value type: %S, %s."),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(),
                    this->m_func->GetDebugNumberSet(debugStringBuffer),
                    Js::OpCodeUtil::GetOpCodeName(ldElem->m_opcode),
                    baseValueTypeStr,
                    (!dst->IsVar() ? _u("specialized") : _u("not specialized")));
                Output::Print(_u("\n"));
                Output::Flush();
            }
        }
        else
        {
            // MOV dst, indirOpnd
            InsertMove(dst, indirOpnd, ldElem);
            if (maskOpnd)
            {
#if TARGET_64
                if (maskOpnd->GetSize() != dst->GetType())
                {
                    maskOpnd = maskOpnd->UseWithNewType(dst->GetType(), m_func)->AsRegOpnd();
                }
#endif
                InsertAnd(dst, dst, maskOpnd, ldElem);
            }

            // The string index fast path does not operate on index properties (we don't get a PropertyString in that case), so
            // we don't need to do any further checks in that case

            // For LdMethodElem, if the loaded value is a tagged number, the error message generated by the helper call is
            // better than if we were to just try to call the number. Also, the call arguments need to be evaluated before
            // throwing the error, so just test whether it's an object and jump to helper if it's not.
            const bool needObjectTest = !isStringIndex && !isNativeArrayLoad && ldElem->m_opcode == Js::OpCode::LdMethodElem;
            needMissingValueCheck =
                !isStringIndex && !(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues());
            if(needMissingValueCheck)
            {
                //  TEST dst, dst
                //  JEQ $helper | JNE $fallthrough
                InsertMissingItemCompareBranch(
                    dst,
                    needObjectTest ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A,
                    needObjectTest ? labelHelper : labelFallThru,
                    ldElem);

                if (isNativeArrayLoad)
                {
                    Assert(!needObjectTest);
                    Assert(labelHelper != labelBailOut);
                    if(ldElem->AsProfiledInstr()->u.ldElemInfo->GetElementType().HasBeenUndefined())
                    {
                        // We're going to bail out trying to load "missing value" into a type-spec'd opnd.
                        // Branch to a point where we'll convert the array so that we don't keep bailing here.
                        // (Gappy arrays are not well-suited to nativeness.)
                        labelMissingNative = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
                        InsertBranch(Js::OpCode::Br, labelMissingNative, ldElem);
                    }
                    else
                    {
                        // If the value has not been profiled to be undefined at some point, jump directly to bail out
                        InsertBranch(Js::OpCode::Br, labelBailOut, ldElem);
                    }
                }
            }
            if(needObjectTest)
            {
                //  GenerateObjectTest(dst)
                //  JIsObject $fallthrough
                m_lowererMD.GenerateObjectTest(dst, ldElem, labelFallThru, true);
            }
            else if(!needMissingValueCheck)
            {
                //  JMP $fallthrough
                InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);
            }

            emittedFastPath = true;
        }
    }
    // $helper:
    //      bailout or caller generated helper call
    // $fallthru:

    if (!emittedFastPath)
    {
        labelHelper->isOpHelper = false;
    }

    ldElem->InsertBefore(labelHelper);
    instrIsInHelperBlock = true;

    if (isNativeArrayLoad)
    {
        Assert(ldElem->HasBailOutInfo());
        Assert(labelHelper != labelBailOut);

        // Transform the original instr:
        //
        // $helper:
        // dst = LdElemI_A src (BailOut)
        // $fallthrough:
        //
        // to:
        //
        // b $fallthru  <--- we get here if we loaded a valid element directly
        // $helper:
        // dst = LdElemI_A src
        // cmp dst, MissingItem
        // bne $fallthrough
        // $bailout:
        //       BailOut
        // $fallthrough:

        LowerOneBailOutKind(ldElem, IR::BailOutConventionalNativeArrayAccessOnly, instrIsInHelperBlock);
        IR::Instr *const insertBeforeInstr = ldElem->m_next;

        // Do missing value check on value returned from helper so that we don't have to check the index against
        // array length. (We already checked it above against the segment length.)

        bool hasBeenUndefined = ldElem->AsProfiledInstr()->u.ldElemInfo->GetElementType().HasBeenUndefined();
        if (hasBeenUndefined)
        {
            if(!emitBailout)
            {
                if (labelMissingNative == nullptr)
                {
                    labelMissingNative = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
#if DBG
                    labelMissingNative->m_noLazyHelperAssert = true;
#endif
                }

                InsertMissingItemCompareBranch(ldElem->GetDst(), Js::OpCode::BrEq_A, labelMissingNative, insertBeforeInstr);
            }
            InsertBranch(Js::OpCode::Br, labelFallThru, insertBeforeInstr);
            if(labelMissingNative)
            {
                // We're going to bail out on a load from a gap, but convert the array to Var first, so we don't just
                // bail here over and over. Gappy arrays are not well suited to nativeness.
                // NOTE: only emit this call if the profile tells us that this has happened before ("hasBeenUndefined").
                // Emitting this in Navier-Stokes brutalizes the score.
                insertBeforeInstr->InsertBefore(labelMissingNative);
                IR::JnHelperMethod helperMethod;
                indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
                if (indirOpnd->GetBaseOpnd()->GetValueType().HasIntElements())
                {
                    helperMethod = IR::HelperIntArr_ToVarArray;
                }
                else
                {
                    Assert(indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements());
                    helperMethod = IR::HelperFloatArr_ToVarArray;
                }
                m_lowererMD.LoadHelperArgument(insertBeforeInstr, indirOpnd->GetBaseOpnd());
                IR::Instr *instrHelper = IR::Instr::New(Js::OpCode::Call, m_func);
                instrHelper->SetSrc1(IR::HelperCallOpnd::New(helperMethod, m_func));
                insertBeforeInstr->InsertBefore(instrHelper);
                m_lowererMD.LowerCall(instrHelper, 0);
            }
        }
        else
        {
            if(!emitBailout)
            {
                InsertMissingItemCompareBranch(ldElem->GetDst(), Js::OpCode::BrEq_A, labelBailOut, insertBeforeInstr);
            }

            InsertBranch(Js::OpCode::Br, labelFallThru, insertBeforeInstr);
        }

        insertBeforeInstr->InsertBefore(labelBailOut);
    }

    if (emitBailout)
    {
        ldElem->UnlinkSrc1();
        ldElem->UnlinkDst();
        GenerateBailOut(ldElem, nullptr, nullptr);
    }

    return !emitBailout;
}